

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

vector<Chainstate_*,_std::allocator<Chainstate_*>_> * __thiscall
ChainstateManager::GetAll
          (vector<Chainstate_*,_std::allocator<Chainstate_*>_> *__return_storage_ptr__,
          ChainstateManager *this)

{
  long lVar1;
  long in_FS_OFFSET;
  Chainstate *cs;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock43;
  value_type local_50;
  unique_lock<std::recursive_mutex> local_48;
  _Head_base<0UL,_Chainstate_*,_false> local_38;
  Chainstate *pCStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_48,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
             ,0x15e0,false);
  (__return_storage_ptr__->super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38._M_head_impl =
       (this->m_ibd_chainstate)._M_t.
       super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
       super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
       super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl;
  pCStack_30 = (this->m_snapshot_chainstate)._M_t.
               super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
               super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
               super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl;
  for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 8) {
    local_50 = *(value_type *)((long)&local_38._M_head_impl + lVar1);
    if ((local_50 != (value_type)0x0) && (local_50->m_disabled == false)) {
      std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::push_back
                (__return_storage_ptr__,&local_50);
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<Chainstate*> ChainstateManager::GetAll()
{
    LOCK(::cs_main);
    std::vector<Chainstate*> out;

    for (Chainstate* cs : {m_ibd_chainstate.get(), m_snapshot_chainstate.get()}) {
        if (this->IsUsable(cs)) out.push_back(cs);
    }

    return out;
}